

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.cc
# Opt level: O3

void brotli::EstimateBitCostsForLiterals
               (size_t pos,size_t len,size_t mask,uint8_t *data,float *cost)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  size_t histogram [256];
  ulong local_838 [257];
  
  bVar1 = IsMostlyUTF8(data,pos,mask,len,0.75);
  if (!bVar1) {
    memset(local_838,0,0x800);
    uVar4 = 2000;
    if (len < 2000) {
      uVar4 = len;
    }
    uVar2 = pos;
    uVar3 = uVar4;
    if (len != 0) {
      do {
        local_838[data[uVar2 & mask]] = local_838[data[uVar2 & mask]] + 1;
        uVar3 = uVar3 - 1;
        uVar2 = uVar2 + 1;
      } while (uVar3 != 0);
      if (len != 0) {
        uVar2 = 2000;
        do {
          if (1999 < uVar2 - 2000) {
            local_838[data[pos - 2000 & mask]] = local_838[data[pos - 2000 & mask]] - 1;
            uVar4 = uVar4 - 1;
          }
          if (uVar2 < len) {
            local_838[data[pos + 2000 & mask]] = local_838[data[pos + 2000 & mask]] + 1;
            uVar4 = uVar4 + 1;
          }
          uVar3 = local_838[data[pos & mask]];
          lVar6 = uVar3 + (uVar3 == 0);
          if (uVar4 < 0x100) {
            dVar7 = (double)*(float *)(kLog2Table + uVar4 * 4);
          }
          else {
            auVar9._8_4_ = (int)(uVar4 >> 0x20);
            auVar9._0_8_ = uVar4;
            auVar9._12_4_ = 0x45300000;
            dVar7 = log2((auVar9._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
          }
          if (uVar3 < 0x100) {
            dVar8 = (double)*(float *)(kLog2Table + lVar6 * 4);
          }
          else {
            auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar10._0_8_ = lVar6;
            auVar10._12_4_ = 0x45300000;
            dVar8 = log2((auVar10._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
          }
          dVar7 = (dVar7 - dVar8) + 0.029;
          cost[uVar2 - 2000] =
               (float)(double)(-(ulong)(dVar7 < 1.0) & (ulong)(dVar7 * 0.5 + 0.5) |
                              ~-(ulong)(dVar7 < 1.0) & (ulong)dVar7);
          pos = pos + 1;
          sVar5 = uVar2 - 1999;
          uVar2 = uVar2 + 1;
        } while (sVar5 != len);
      }
    }
    return;
  }
  EstimateBitCostsForLiteralsUTF8(pos,len,mask,data,cost);
  return;
}

Assistant:

void EstimateBitCostsForLiterals(size_t pos, size_t len, size_t mask,
                                 const uint8_t *data, float *cost) {
  if (IsMostlyUTF8(data, pos, mask, len, kMinUTF8Ratio)) {
    EstimateBitCostsForLiteralsUTF8(pos, len, mask, data, cost);
    return;
  }
  size_t histogram[256] = { 0 };
  size_t window_half = 2000;
  size_t in_window = std::min(window_half, len);

  // Bootstrap histogram.
  for (size_t i = 0; i < in_window; ++i) {
    ++histogram[data[(pos + i) & mask]];
  }

  // Compute bit costs with sliding window.
  for (size_t i = 0; i < len; ++i) {
    if (i >= window_half) {
      // Remove a byte in the past.
      --histogram[data[(pos + i - window_half) & mask]];
      --in_window;
    }
    if (i + window_half < len) {
      // Add a byte in the future.
      ++histogram[data[(pos + i + window_half) & mask]];
      ++in_window;
    }
    size_t histo = histogram[data[(pos + i) & mask]];
    if (histo == 0) {
      histo = 1;
    }
    double lit_cost = FastLog2(in_window) - FastLog2(histo);
    lit_cost += 0.029;
    if (lit_cost < 1.0) {
      lit_cost *= 0.5;
      lit_cost += 0.5;
    }
    cost[i] = static_cast<float>(lit_cost);
  }
}